

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::HandleSpecialValues
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder)

{
  long lVar1;
  bool bVar2;
  StringBuilder *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  Double double_inspect;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Double::Double((Double *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  bVar2 = Double::IsInfinite((Double *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                            );
  if (bVar2) {
    if (*(long *)(in_RDI + 8) == 0) {
      local_11 = false;
    }
    else {
      if (in_XMM0_Qa < 0.0) {
        StringBuilder::AddCharacter
                  ((StringBuilder *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbf);
      }
      StringBuilder::AddString(in_RSI,in_RDI);
      local_11 = true;
    }
  }
  else {
    bVar2 = Double::IsNan((Double *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (bVar2) {
      if (*(long *)(in_RDI + 0x10) == 0) {
        local_11 = false;
      }
      else {
        StringBuilder::AddString(in_RSI,in_RDI);
        local_11 = true;
      }
    }
    else {
      local_11 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::HandleSpecialValues(
    double value,
    StringBuilder* result_builder) const {
  Double double_inspect(value);
  if (double_inspect.IsInfinite()) {
    if (infinity_symbol_ == DOUBLE_CONVERSION_NULLPTR) return false;
    if (value < 0) {
      result_builder->AddCharacter('-');
    }
    result_builder->AddString(infinity_symbol_);
    return true;
  }
  if (double_inspect.IsNan()) {
    if (nan_symbol_ == DOUBLE_CONVERSION_NULLPTR) return false;
    result_builder->AddString(nan_symbol_);
    return true;
  }
  return false;
}